

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_true>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_true>
             *this,double *blockB,const_blas_data_mapper<double,_long,_0> *rhs,long depth,long cols,
            long stride,long offset)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  long local_260;
  long k_1;
  LinearMapper dm0_1;
  long j2_1;
  long k;
  LinearMapper dm3;
  LinearMapper dm2;
  LinearMapper dm1;
  LinearMapper dm0;
  long j2;
  long peeled_k;
  long count;
  long packet_cols4;
  long packet_cols8;
  long lStack_1f0;
  conj_if<false> cj;
  long stride_local;
  long cols_local;
  long depth_local;
  const_blas_data_mapper<double,_long,_0> *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_true>
  *this_local;
  undefined1 local_158 [8];
  double *local_150;
  undefined8 local_148;
  const_blas_data_mapper<double,_long,_0> *local_140;
  double *local_138;
  undefined1 *local_130;
  long local_128;
  undefined8 local_120;
  const_blas_data_mapper<double,_long,_0> *local_118;
  undefined1 local_110 [8];
  long local_108;
  undefined8 local_100;
  const_blas_data_mapper<double,_long,_0> *local_f8;
  double *local_f0;
  undefined1 *local_e8;
  long local_e0;
  undefined8 local_d8;
  const_blas_data_mapper<double,_long,_0> *local_d0;
  undefined1 local_c8 [8];
  long local_c0;
  undefined8 local_b8;
  const_blas_data_mapper<double,_long,_0> *local_b0;
  double *local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined8 local_90;
  const_blas_data_mapper<double,_long,_0> *local_88;
  undefined1 local_80 [8];
  long local_78;
  undefined8 local_70;
  const_blas_data_mapper<double,_long,_0> *local_68;
  double *local_60;
  undefined1 *local_58;
  double *local_50;
  undefined8 local_48;
  const_blas_data_mapper<double,_long,_0> *local_40;
  undefined1 local_38 [8];
  double *local_30;
  undefined8 local_28;
  const_blas_data_mapper<double,_long,_0> *local_20;
  double *local_18;
  undefined1 *local_10;
  
  lStack_1f0 = stride;
  ignore_unused_variable<long>(&stack0xfffffffffffffe10);
  ignore_unused_variable<long>(&offset);
  if (lStack_1f0 < depth || lStack_1f0 < offset) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x779,
                  "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 0, false, true>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
                 );
  }
  dm0_1.m_data = (double *)(cols / 4 << 2);
  peeled_k = 0;
  for (dm0.m_data = (double *)0x0; (long)dm0.m_data < (long)dm0_1.m_data;
      dm0.m_data = dm0.m_data + 4) {
    peeled_k = offset * 4 + peeled_k;
    local_48 = 0;
    local_50 = dm0.m_data;
    local_28 = 0;
    local_30 = dm0.m_data;
    pdVar1 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             (long)dm0.m_data * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    local_10 = local_38;
    local_98 = (long)dm0.m_data + 1;
    local_90 = 0;
    local_70 = 0;
    pdVar5 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             local_98 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    local_58 = local_80;
    local_e0 = (long)dm0.m_data + 2;
    local_d8 = 0;
    local_b8 = 0;
    pdVar2 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             local_e0 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    local_a0 = local_c8;
    local_128 = (long)dm0.m_data + 3;
    local_120 = 0;
    local_100 = 0;
    pdVar3 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             local_128 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    local_e8 = local_110;
    local_118 = rhs;
    local_108 = local_128;
    local_f8 = rhs;
    local_f0 = pdVar3;
    local_d0 = rhs;
    local_c0 = local_e0;
    local_b0 = rhs;
    local_a8 = pdVar2;
    local_88 = rhs;
    local_78 = local_98;
    local_68 = rhs;
    local_60 = pdVar5;
    local_40 = rhs;
    local_20 = rhs;
    local_18 = pdVar1;
    for (j2_1 = 0; j2_1 < depth; j2_1 = j2_1 + 1) {
      pdVar4 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar1 + j2_1)
      ;
      blockB[peeled_k] = *pdVar4;
      pdVar4 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar5 + j2_1)
      ;
      blockB[peeled_k + 1] = *pdVar4;
      pdVar4 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar2 + j2_1)
      ;
      blockB[peeled_k + 2] = *pdVar4;
      pdVar4 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar3 + j2_1)
      ;
      blockB[peeled_k + 3] = *pdVar4;
      peeled_k = peeled_k + 4;
    }
    peeled_k = ((lStack_1f0 - offset) - depth) * 4 + peeled_k;
  }
  for (; (long)dm0_1.m_data < cols; dm0_1.m_data = dm0_1.m_data + 1) {
    peeled_k = offset + peeled_k;
    local_148 = 0;
    local_150 = dm0_1.m_data;
    pdVar1 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             (long)dm0_1.m_data * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    local_130 = local_158;
    local_140 = rhs;
    local_138 = pdVar1;
    for (local_260 = 0; local_260 < depth; local_260 = local_260 + 1) {
      pdVar5 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols8 + 7),pdVar1 + local_260);
      blockB[peeled_k] = *pdVar5;
      peeled_k = peeled_k + 1;
    }
    peeled_k = ((lStack_1f0 - offset) - depth) + peeled_k;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enbale vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0] = dm0.loadPacket(k);
          kernel.packet[1%PacketSize] = dm1.loadPacket(k);
          kernel.packet[2%PacketSize] = dm2.loadPacket(k);
          kernel.packet[3%PacketSize] = dm3.loadPacket(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}